

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approx_count.cpp
# Opt level: O1

void duckdb::ApproxCountDistinctSimpleUpdateFunction
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,data_ptr_t state,
               idx_t count)

{
  InternalException *this;
  Vector hash_vec;
  LogicalType aLStack_a8 [24];
  undefined1 *local_90;
  LogicalType local_88 [8];
  undefined1 local_80 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (count < 0x801) {
    duckdb::LogicalType::LogicalType(aLStack_a8,UBIGINT);
    duckdb::Vector::Vector((Vector *)&local_90,aLStack_a8,count);
    duckdb::LogicalType::~LogicalType(aLStack_a8);
    duckdb::VectorOperations::Hash(inputs,(Vector *)&local_90,count);
    duckdb::HyperLogLog::Update((Vector *)state,inputs,(ulong)&local_90);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    duckdb::LogicalType::~LogicalType(local_88);
    return;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"ApproxCountDistinct - count must be at most vector size","");
  duckdb::InternalException::InternalException(this,(string *)&local_90);
  __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void ApproxCountDistinctSimpleUpdateFunction(Vector inputs[], AggregateInputData &, idx_t input_count,
                                                    data_ptr_t state, idx_t count) {
	D_ASSERT(input_count == 1);
	auto &input = inputs[0];

	if (count > STANDARD_VECTOR_SIZE) {
		throw InternalException("ApproxCountDistinct - count must be at most vector size");
	}
	Vector hash_vec(LogicalType::HASH, count);
	VectorOperations::Hash(input, hash_vec, count);

	auto agg_state = reinterpret_cast<ApproxDistinctCountState *>(state);
	agg_state->hll.Update(input, hash_vec, count);
}